

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

void __thiscall cmCTest::SetSpecificTrack(cmCTest *this,char *track)

{
  char *pcVar1;
  
  if (track != (char *)0x0) {
    pcVar1 = (char *)(this->SpecificTrack)._M_string_length;
    strlen(track);
    std::__cxx11::string::_M_replace((ulong)&this->SpecificTrack,0,pcVar1,(ulong)track);
    return;
  }
  (this->SpecificTrack)._M_string_length = 0;
  *(this->SpecificTrack)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void cmCTest::SetSpecificTrack(const char* track)
{
  if (!track) {
    this->SpecificTrack.clear();
    return;
  }
  this->SpecificTrack = track;
}